

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

float nk_slider_behavior(nk_flags *state,nk_rect *logical_cursor,nk_rect *visual_cursor,nk_input *in
                        ,nk_rect bounds,float slider_min,float slider_max,float slider_value,
                        float slider_step,float slider_steps)

{
  nk_rect b;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect rect_01;
  nk_bool nVar1;
  nk_input *in_RCX;
  float *in_RDX;
  float *in_RSI;
  uint *in_RDI;
  bool bVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float in_XMM4_Da;
  float in_XMM5_Da;
  float in_XMM6_Da;
  float steps;
  float pxstep;
  float d;
  float ratio;
  int left_mouse_click_in_cursor;
  int left_mouse_down;
  float local_78;
  float local_74;
  nk_bool in_stack_ffffffffffffff90;
  nk_buttons in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  float in_stack_ffffffffffffffb0;
  float local_3c;
  float local_10;
  float local_8;
  float fStack_4;
  
  local_10 = (float)in_XMM0_Qa;
  local_8 = (float)in_XMM1_Qa;
  fStack_4 = (float)((ulong)in_XMM1_Qa >> 0x20);
  if ((*in_RDI & 2) == 0) {
    *in_RDI = 4;
  }
  else {
    *in_RDI = 6;
  }
  bVar2 = false;
  if (in_RCX != (nk_input *)0x0) {
    bVar2 = (in_RCX->mouse).buttons[0].down != 0;
  }
  bVar3 = false;
  if (in_RCX != (nk_input *)0x0) {
    b.y = (float)in_stack_ffffffffffffffa8;
    b.x = (float)in_stack_ffffffffffffffa4;
    b.w = (float)in_stack_ffffffffffffffac;
    b.h = in_stack_ffffffffffffffb0;
    nVar1 = nk_input_has_mouse_click_down_in_rect
                      ((nk_input *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                       in_stack_ffffffffffffff94,b,in_stack_ffffffffffffff90);
    bVar3 = nVar1 != 0;
  }
  local_3c = in_XMM4_Da;
  if ((bVar2) && (bVar3)) {
    fVar4 = (in_RCX->mouse).pos.x - (in_RDX[2] * 0.5 + *in_RDX);
    *in_RDI = 0x22;
    fVar5 = fVar4;
    if (fVar4 < 0.0) {
      fVar5 = -fVar4;
    }
    if (local_8 / in_XMM6_Da <= fVar5) {
      fVar5 = fVar4;
      if (fVar4 < 0.0) {
        fVar5 = -fVar4;
      }
      fVar5 = (float)(int)(fVar5 / (local_8 / in_XMM6_Da));
      if (fVar4 <= 0.0) {
        fVar5 = -(in_XMM5_Da * fVar5);
      }
      else {
        fVar5 = in_XMM5_Da * fVar5;
      }
      fVar5 = fVar5 + in_XMM4_Da;
      fVar4 = in_XMM3_Da;
      if (fVar5 < in_XMM3_Da) {
        fVar4 = fVar5;
      }
      local_74 = in_XMM2_Da;
      if (in_XMM2_Da <= fVar4) {
        local_78 = in_XMM3_Da;
        if (fVar5 < in_XMM3_Da) {
          local_78 = fVar5;
        }
        local_74 = local_78;
      }
      local_3c = local_74;
      *in_RSI = in_RSI[2] * ((local_74 - in_XMM2_Da) / in_XMM5_Da) + local_10;
      (in_RCX->mouse).buttons[0].clicked_pos.x = *in_RSI;
    }
  }
  rect.w = local_8;
  rect._0_8_ = in_XMM0_Qa;
  rect.h = fStack_4;
  nVar1 = nk_input_is_mouse_hovering_rect(in_RCX,rect);
  if (nVar1 != 0) {
    *in_RDI = 0x12;
  }
  if (((*in_RDI & 0x10) == 0) ||
     (rect_00.w = local_8, rect_00._0_8_ = in_XMM0_Qa, rect_00.h = fStack_4,
     nVar1 = nk_input_is_mouse_prev_hovering_rect(in_RCX,rect_00), nVar1 != 0)) {
    rect_01.w = local_8;
    rect_01._0_8_ = in_XMM0_Qa;
    rect_01.h = fStack_4;
    nVar1 = nk_input_is_mouse_prev_hovering_rect(in_RCX,rect_01);
    if (nVar1 != 0) {
      *in_RDI = *in_RDI | 0x40;
    }
  }
  else {
    *in_RDI = *in_RDI | 8;
  }
  return local_3c;
}

Assistant:

NK_LIB float
nk_slider_behavior(nk_flags *state, struct nk_rect *logical_cursor,
struct nk_rect *visual_cursor, struct nk_input *in,
struct nk_rect bounds, float slider_min, float slider_max, float slider_value,
float slider_step, float slider_steps)
{
int left_mouse_down;
int left_mouse_click_in_cursor;

/* check if visual cursor is being dragged */
nk_widget_state_reset(state);
left_mouse_down = in && in->mouse.buttons[NK_BUTTON_LEFT].down;
left_mouse_click_in_cursor = in && nk_input_has_mouse_click_down_in_rect(in,
NK_BUTTON_LEFT, *visual_cursor, nk_true);

if (left_mouse_down && left_mouse_click_in_cursor) {
float ratio = 0;
const float d = in->mouse.pos.x - (visual_cursor->x+visual_cursor->w*0.5f);
const float pxstep = bounds.w / slider_steps;

/* only update value if the next slider step is reached */
*state = NK_WIDGET_STATE_ACTIVE;
if (NK_ABS(d) >= pxstep) {
const float steps = (float)((int)(NK_ABS(d) / pxstep));
slider_value += (d > 0) ? (slider_step*steps) : -(slider_step*steps);
slider_value = NK_CLAMP(slider_min, slider_value, slider_max);
ratio = (slider_value - slider_min)/slider_step;
logical_cursor->x = bounds.x + (logical_cursor->w * ratio);
in->mouse.buttons[NK_BUTTON_LEFT].clicked_pos.x = logical_cursor->x;
}
}

/* slider widget state */
if (nk_input_is_mouse_hovering_rect(in, bounds))
*state = NK_WIDGET_STATE_HOVERED;
if (*state & NK_WIDGET_STATE_HOVER &&
!nk_input_is_mouse_prev_hovering_rect(in, bounds))
*state |= NK_WIDGET_STATE_ENTERED;
else if (nk_input_is_mouse_prev_hovering_rect(in, bounds))
*state |= NK_WIDGET_STATE_LEFT;
return slider_value;
}